

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O0

milliseconds checkInterval(char *caller,milliseconds interval)

{
  bool bVar1;
  rep in_RSI;
  duration<long,_std::ratio<1L,_1000L>_> *in_RDI;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1000L>_> maxInterval;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff78;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff80;
  QMessageLogger *in_stack_ffffffffffffff90;
  QMessageLogger local_48;
  rep local_28;
  rep local_20;
  rep local_18;
  rep local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0x7fffffff;
  local_18 = in_RSI;
  local_28 = (rep)ms<(char)48>();
  bVar1 = std::chrono::operator<(in_RDI,in_stack_ffffffffffffff80);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff90,(char *)in_RDI,
               (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(char *)in_stack_ffffffffffffff78);
    QMessageLogger::warning
              (&local_48,"%s: negative intervals aren\'t allowed; the interval will be set to 1ms.",
               in_RDI);
    local_18 = (rep)ms<(char)49>();
  }
  else {
    bVar1 = std::chrono::operator>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff90,(char *)in_RDI,
                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(char *)in_stack_ffffffffffffff78);
      QMessageLogger::warning
                ((QMessageLogger *)&stack0xffffffffffffff90,
                 "%s: interval exceeds maximum allowed interval, it will be clamped to INT_MAX ms (about 24 days)."
                 ,in_RDI);
      local_18 = local_20;
    }
  }
  local_10 = local_18;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (milliseconds)local_18;
}

Assistant:

static std::chrono::milliseconds
checkInterval(const char *caller, std::chrono::milliseconds interval)
{
    constexpr auto maxInterval = INT_MAX * 1ms;
    if (interval < 0ms) {
        qWarning("%s: negative intervals aren't allowed; the interval will be set to 1ms.", caller);
        interval = 1ms;
    } else if (interval > maxInterval) {
        qWarning("%s: interval exceeds maximum allowed interval, it will be clamped to "
                 "INT_MAX ms (about 24 days).", caller);
        interval = maxInterval;
    }
    return interval;
}